

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

LY_ERR lys_compile_unres_dflt
                 (lysc_ctx *ctx,lysc_node *node,lysc_type *type,char *dflt,lysp_module *dflt_pmod,
                 lyd_value *storage,lys_glob_unres *unres)

{
  uint32_t *puVar1;
  uint16_t uVar2;
  ly_ctx *plVar3;
  LY_ERR LVar4;
  size_t sVar5;
  LY_ERR LVar6;
  ly_err_item *err;
  lysc_ctx *local_48;
  lyplg_type_store_clb local_40;
  lysp_module *local_38;
  
  err = (ly_err_item *)0x0;
  plVar3 = ctx->ctx;
  uVar2 = plVar3->flags;
  local_40 = type->plugin->store;
  local_48 = ctx;
  local_38 = dflt_pmod;
  sVar5 = strlen(dflt);
  LVar4 = (*local_40)(plVar3,type,dflt,sVar5,(uint)uVar2 & 2,LY_VALUE_SCHEMA,local_38,0x3ff,node,
                      storage,unres,&err);
  LVar6 = LY_ERECOMPILE;
  if (LVar4 != LY_ERECOMPILE) {
    LVar6 = LY_SUCCESS;
    if (LVar4 == LY_EINCOMPLETE) {
      LVar4 = LY_SUCCESS;
    }
    if (LVar4 == LY_SUCCESS) {
      LOCK();
      puVar1 = &storage->realtype->refcount;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      if (storage->realtype->basetype == LY_TYPE_INST) {
        ly_path_free((storage->field_2).target);
        (storage->field_2).dec64 = 0;
      }
    }
    else {
      ly_log_location(node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      if (err == (ly_err_item *)0x0) {
        ly_vlog(local_48->ctx,(char *)0x0,LYVE_SEMANTICS,
                "Invalid default - value does not fit the type.");
      }
      else {
        ly_vlog(local_48->ctx,(char *)0x0,LYVE_SEMANTICS,
                "Invalid default - value does not fit the type (%s).",err->msg);
        ly_err_free(err);
      }
      ly_log_location_revert(1,0,0,0);
      LVar6 = LVar4;
    }
  }
  return LVar6;
}

Assistant:

static LY_ERR
lys_compile_unres_dflt(struct lysc_ctx *ctx, struct lysc_node *node, struct lysc_type *type, const char *dflt,
        const struct lysp_module *dflt_pmod, struct lyd_value *storage, struct lys_glob_unres *unres)
{
    LY_ERR ret;
    uint32_t options;
    struct ly_err_item *err = NULL;

    options = (ctx->ctx->flags & LY_CTX_REF_IMPLEMENTED) ? LYPLG_TYPE_STORE_IMPLEMENT : 0;
    ret = type->plugin->store(ctx->ctx, type, dflt, strlen(dflt), options, LY_VALUE_SCHEMA, (void *)dflt_pmod,
            LYD_HINT_SCHEMA, node, storage, unres, &err);
    if (ret == LY_ERECOMPILE) {
        /* fine, but we need to recompile */
        return LY_ERECOMPILE;
    } else if (ret == LY_EINCOMPLETE) {
        /* we have no data so we will not be resolving it */
        ret = LY_SUCCESS;
    }

    if (ret) {
        LOG_LOCSET(node, NULL);
        if (err) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid default - value does not fit the type (%s).", err->msg);
            ly_err_free(err);
        } else {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid default - value does not fit the type.");
        }
        LOG_LOCBACK(1, 0);
        return ret;
    }

    LY_ATOMIC_INC_BARRIER(((struct lysc_type *)storage->realtype)->refcount);
    if (storage->realtype->basetype == LY_TYPE_INST) {
        /* ly_path includes references to other nodes, in case they are in foreign modules, the context would
         * need to be freed in specific order to avoid accessing freed memory, so just avoid storing it */
        ly_path_free(storage->target);
        storage->target = NULL;
    }
    return LY_SUCCESS;
}